

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O1

void __thiscall GPIOClass::GPIOClass(GPIOClass *this,string *gnum)

{
  (this->gpionum)._M_dataplus._M_p = (pointer)&(this->gpionum).field_2;
  (this->gpionum)._M_string_length = 0;
  (this->gpionum).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

GPIOClass::GPIOClass(string gnum)
{
    this->gpionum = gnum;  //Instatiate GPIOClass object for GPIO pin number "gnum"
}